

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfInputFile * ImfOpenInputFile(char *name)

{
  ImfInputFile *pIVar1;
  RgbaInputFile *in_RDI;
  exception *e;
  char *in_stack_ffffffffffffffb8;
  
  pIVar1 = (ImfInputFile *)operator_new(0x40);
  Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(in_RDI,in_stack_ffffffffffffffb8,0);
  return pIVar1;
}

Assistant:

ImfInputFile*
ImfOpenInputFile (const char name[])
{
    try
    {
        return (ImfInputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            RgbaInputFile (name);
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}